

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.c
# Opt level: O0

void initFlags(char *problem,char **FLAG,lattice *grid,MPI_Comm Region)

{
  long lVar1;
  int iVar2;
  undefined8 uStack_90;
  undefined1 auStack_88 [12];
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int j_2;
  int i_2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint local_44;
  int local_40;
  int size;
  int x;
  int j_1;
  int i_1;
  int j;
  int i;
  int max;
  MPI_Comm Region_local;
  lattice *grid_local;
  char **FLAG_local;
  char *problem_local;
  
  uStack_90 = 0x10620b;
  _i = Region;
  Region_local = (MPI_Comm)grid;
  grid_local = (lattice *)FLAG;
  FLAG_local = (char **)problem;
  iVar2 = strcmp(problem,"Step");
  if (iVar2 == 0) {
    j = *(int *)(Region_local + 0x14);
    if (*(int *)(Region_local + 0x10) < j) {
      j = *(int *)(Region_local + 0x10);
    }
    j = (j + 2) / 2;
    for (i_1 = 0; (i_1 < *(int *)(Region_local + 0x20) + 2 &&
                  (i_1 + *(int *)(Region_local + 0x18) < j)); i_1 = i_1 + 1) {
      for (j_1 = 0; (j_1 < *(int *)(Region_local + 0x24) + 2 &&
                    (j_1 + *(int *)(Region_local + 0x1c) < j)); j_1 = j_1 + 1) {
        *(undefined1 *)((long)(&grid_local->delx)[i_1] + (long)j_1) = 0;
      }
    }
  }
  else {
    uStack_90 = 0x1062d8;
    iVar2 = strcmp((char *)FLAG_local,"Von Karman");
    if (iVar2 == 0) {
      for (x = 0; x < *(int *)(Region_local + 0x24) + 2; x = x + 1) {
        local_6c = x + *(int *)(Region_local + 0x18);
        if (*(int *)(Region_local + 0x14) / 3 <= x + *(int *)(Region_local + 0x18)) {
          local_70 = x + *(int *)(Region_local + 0x18);
          if ((*(int *)(Region_local + 0x14) << 1) / 3 <= x + *(int *)(Region_local + 0x18)) break;
          for (size = -(*(int *)(Region_local + 0x14) / 4) / 2; local_74 = size,
              size <= (int)((long)((ulong)(uint)((int)((long)*(int *)(Region_local + 0x14) / 4) >>
                                                0x1f) << 0x20 |
                                  (long)*(int *)(Region_local + 0x14) / 4 & 0xffffffffU) / 2);
              size = size + 1) {
            local_40 = x + size + *(int *)(Region_local + 0x18) + *(int *)(Region_local + 0x1c);
            local_78 = local_40;
            if (*(int *)(Region_local + 0x14) / 3 <= local_40) {
              local_7c = local_40;
              if (((*(int *)(Region_local + 0x14) << 1) / 3 <= local_40) ||
                 (*(int *)(Region_local + 0x20) <= local_40)) break;
              *(undefined1 *)((long)(&grid_local->delx)[x + size + 1] + (long)(x + 1)) = 0;
            }
          }
        }
      }
    }
  }
  local_44 = *(int *)(Region_local + 0x20) + 2U;
  if ((int)(*(int *)(Region_local + 0x20) + 2U) < *(int *)(Region_local + 0x24) + 2) {
    local_44 = *(int *)(Region_local + 0x24) + 2;
  }
  __vla_expr0 = (unsigned_long)auStack_88;
  __vla_expr1 = (ulong)local_44;
  lVar1 = (-0x88 - ((ulong)local_44 + 0xf & 0xfffffffffffffff0)) -
          ((ulong)local_44 + 0xf & 0xfffffffffffffff0);
  _j_2 = (ulong)local_44;
  *(undefined8 *)(auStack_88 + lVar1 + 0x80) = 0x1064bc;
  exchangeIntMat(*(char ***)(&stack0x00000000 + lVar1 + 0x88),
                 *(char **)((long)&problem_local + lVar1 + 0x88),
                 *(char **)((long)&FLAG_local + lVar1 + 0x88),
                 *(lattice **)((long)&grid_local + lVar1 + 0x88),
                 *(MPI_Comm *)((long)&Region_local + lVar1 + 0x88));
  for (local_64 = 0; local_64 < *(int *)(Region_local + 0x20) + 2; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < *(int *)(Region_local + 0x24) + 2; local_68 = local_68 + 1) {
      if ((*(int *)(Region_local + 0x24) < local_68) ||
         (*(char *)((long)(&grid_local->delx)[local_64] + (long)(local_68 + 1)) != '\x0f')) {
        if ((local_68 != 0) &&
           (*(char *)((long)(&grid_local->delx)[local_64] + (long)(local_68 + -1)) == '\x0f')) {
          *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) =
               *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) | 4;
        }
      }
      else {
        *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) =
             *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) | 1;
      }
      if ((*(int *)(Region_local + 0x20) < local_64) ||
         (*(char *)((long)(&grid_local->delx)[local_64 + 1] + (long)local_68) != '\x0f')) {
        if ((local_64 != 0) &&
           (*(char *)((long)(&grid_local->delx)[local_64 + -1] + (long)local_68) == '\x0f')) {
          *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) =
               *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) | 8;
        }
      }
      else {
        *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) =
             *(byte *)((long)(&grid_local->delx)[local_64] + (long)local_68) | 2;
      }
    }
  }
  return;
}

Assistant:

void initFlags (const char *problem, char **FLAG, lattice *grid, MPI_Comm Region)
{
	/* Manually sets the flag field for arbitrary generalised geometries.
	 * If the flags are read from a file, set problem to "Image"! */
	if (strcmp(problem,"Step") == 0)
	{
		int max = grid->jmax;
		if (grid->imax < max)
			max = grid->imax;
		max = (max+2)/2;
		for (int i = 0; i < grid->deli+2; i++)
		{
			if (i + grid->il >= max)
				break;
			for (int j = 0; j < grid->delj+2; j++)
			{
				if (j + grid->jb >= max)
					break;
				FLAG[i][j] = C_B;
			}
		}
	}
	else if (strcmp(problem,"Von Karman") == 0)
	{
		for (int i = 0; i < grid->delj+2; i++)
		{
			if (i + grid->il < grid->jmax/3)
				continue;
			if (i + grid->il >= 2*grid->jmax/3)
				break;
			for (int j = -(grid->jmax/4)/2; j <= (grid->jmax/4)/2; j++)
			{
				int x = i+j+grid->il+grid->jb;
				if (x < grid->jmax/3)
					continue;
				if (x >= 2*grid->jmax/3 || x >= grid->deli)
					break;
				FLAG[i+j+1][i+1] = C_B;
			}
		}
	}
	int size = grid->deli+2;
	if (grid->delj+2 > size)
		size = grid->delj+2;
	char buf1[size], buf2[size];
	exchangeIntMat(FLAG,buf1,buf2,grid,Region);
	for (int i = 0; i < grid->deli+2; i++)
	{
		for (int j = 0; j < grid->delj+2; j++)
		{
			if ((j <= grid->delj) && (FLAG[i][j+1] == C_F))
				FLAG[i][j] |= B_N;
			else if ((j != 0) && (FLAG[i][j-1] == C_F))
				FLAG[i][j] |= B_S;
			if ((i <= grid->deli) && (FLAG[i+1][j] == C_F))
				FLAG[i][j] |= B_O;
			else if ((i != 0) && (FLAG[i-1][j] == C_F))
				FLAG[i][j] |= B_W;
		}
	}
	return;
}